

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprocess_unix.cpp
# Opt level: O0

bool __thiscall QProcessPrivate::waitForStarted(QProcessPrivate *this,QDeadlineTimer *deadline)

{
  long lVar1;
  int iVar2;
  QProcessPrivate *in_RSI;
  long in_FS_OFFSET;
  bool startedEmitted;
  pollfd pfd;
  undefined2 in_stack_ffffffffffffff80;
  short in_stack_ffffffffffffff82;
  int in_stack_ffffffffffffff84;
  undefined4 in_stack_ffffffffffffff88;
  ProcessError in_stack_ffffffffffffff8c;
  pollfd *in_stack_ffffffffffffff90;
  QProcessPrivate *this_00;
  bool local_39;
  QDeadlineTimer in_stack_ffffffffffffffd0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  qt_make_pollfd(in_stack_ffffffffffffff84,in_stack_ffffffffffffff82);
  iVar2 = qt_safe_poll(in_stack_ffffffffffffff90,
                       CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                       in_stack_ffffffffffffffd0);
  if (iVar2 == 0) {
    this_00 = (QProcessPrivate *)&stack0xffffffffffffffc8;
    QString::QString((QString *)0x7a28f4);
    setError(this_00,in_stack_ffffffffffffff8c,
             (QString *)
             CONCAT44(in_stack_ffffffffffffff84,
                      CONCAT22(in_stack_ffffffffffffff82,in_stack_ffffffffffffff80)));
    QString::~QString((QString *)0x7a2914);
    local_39 = false;
  }
  else {
    local_39 = _q_startupNotification(in_RSI);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_39;
  }
  __stack_chk_fail();
}

Assistant:

bool QProcessPrivate::waitForStarted(const QDeadlineTimer &deadline)
{
#if defined (QPROCESS_DEBUG)
    const qint64 msecs = deadline.remainingTime();
    qDebug("QProcessPrivate::waitForStarted(%lld) waiting for child to start (fd = %d)",
           msecs, childStartedPipe[0]);
#endif

    pollfd pfd = qt_make_pollfd(childStartedPipe[0], POLLIN);

    if (qt_safe_poll(&pfd, 1, deadline) == 0) {
        setError(QProcess::Timedout);
#if defined (QPROCESS_DEBUG)
        qDebug("QProcessPrivate::waitForStarted(%lld) == false (timed out)", msecs);
#endif
        return false;
    }

    bool startedEmitted = _q_startupNotification();
#if defined (QPROCESS_DEBUG)
    qDebug("QProcessPrivate::waitForStarted() == %s", startedEmitted ? "true" : "false");
#endif
    return startedEmitted;
}